

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O3

void __thiscall BackwardPass::DeadStoreTypeCheckBailOut(BackwardPass *this,Instr *instr)

{
  Opnd **ppOVar1;
  Opnd **ppOVar2;
  SymOpnd *pSVar3;
  code *pcVar4;
  bool bVar5;
  OpndKind OVar6;
  BailOutKind kind;
  undefined4 *puVar7;
  PropertySymOpnd *propertySymOpnd;
  BailOutInfo *pBVar8;
  Opnd **ppOVar9;
  BailOutKind local_38;
  bool local_31;
  BailOutKind bailOutKind;
  bool isTypeCheckProtected;
  
  if (this->tag != DeadStorePhase) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x8e0,"(this->tag == Js::DeadStorePhase)","this->tag == Js::DeadStorePhase")
    ;
    if (!bVar5) goto LAB_003db445;
    *puVar7 = 0;
  }
  if (this->currentPrePassLoop != (Loop *)0x0) {
    return;
  }
  if ((instr->field_0x38 & 0x10) == 0) {
    return;
  }
  if ((instr->m_dst != (Opnd *)0x0) &&
     (OVar6 = IR::Opnd::GetKind(instr->m_dst), OVar6 == OpndKindSym)) {
    return;
  }
  kind = IR::Instr::GetBailOutKind(instr);
  bVar5 = IR::IsTypeCheckBailOutKind(kind);
  if (!bVar5) {
    return;
  }
  ppOVar1 = &instr->m_dst;
  ppOVar2 = &instr->m_src1;
  if ((instr->m_src1 == (Opnd *)0x0) ||
     (OVar6 = IR::Opnd::GetKind(instr->m_src1), OVar6 != OpndKindSym)) {
LAB_003db0f9:
    if ((*ppOVar1 != (Opnd *)0x0) && (OVar6 = IR::Opnd::GetKind(*ppOVar1), OVar6 == OpndKindSym)) {
      pSVar3 = (SymOpnd *)*ppOVar1;
      OVar6 = IR::Opnd::GetKind((Opnd *)pSVar3);
      if (OVar6 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar5) goto LAB_003db445;
        *puVar7 = 0;
      }
      bVar5 = IR::SymOpnd::IsPropertySymOpnd(pSVar3);
      if (bVar5) goto LAB_003db1d6;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x8f6,
                       "((instr->GetSrc1() && instr->GetSrc1()->IsSymOpnd() && instr->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd()) || (instr->GetDst() && instr->GetDst()->IsSymOpnd() && instr->GetDst()->AsSymOpnd()->IsPropertySymOpnd()))"
                       ,
                       "(instr->GetSrc1() && instr->GetSrc1()->IsSymOpnd() && instr->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd()) || (instr->GetDst() && instr->GetDst()->IsSymOpnd() && instr->GetDst()->AsSymOpnd()->IsPropertySymOpnd())"
                      );
    if (!bVar5) goto LAB_003db445;
    *puVar7 = 0;
  }
  else {
    pSVar3 = (SymOpnd *)*ppOVar2;
    OVar6 = IR::Opnd::GetKind((Opnd *)pSVar3);
    if (OVar6 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar5) goto LAB_003db445;
      *puVar7 = 0;
    }
    bVar5 = IR::SymOpnd::IsPropertySymOpnd(pSVar3);
    if (!bVar5) goto LAB_003db0f9;
  }
LAB_003db1d6:
  if ((*ppOVar1 == (Opnd *)0x0) ||
     (OVar6 = IR::Opnd::GetKind(*ppOVar1), ppOVar9 = ppOVar1, OVar6 != OpndKindSym)) {
    ppOVar9 = ppOVar2;
  }
  propertySymOpnd = IR::Opnd::AsPropertySymOpnd(*ppOVar9);
  if ((char)(propertySymOpnd->field_12).field_0.field_5.typeCheckSeqFlags < '\0') {
    return;
  }
  local_31 = false;
  bVar5 = GlobOpt::NeedsTypeCheckBailOut
                    (instr,propertySymOpnd,propertySymOpnd == (PropertySymOpnd *)instr->m_dst,
                     &local_31,&local_38);
  if (bVar5) {
    if ((local_38 & ~BailOutNumberOnly) != BailOutFailedFixedFieldTypeCheck &&
        (kind & ~BailOutKindBits) != local_38) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x908,
                         "((oldBailOutKind & ~IR::BailOutKindBits) == bailOutKind || bailOutKind == IR::BailOutFailedFixedFieldTypeCheck || bailOutKind == IR::BailOutFailedEquivalentFixedFieldTypeCheck)"
                         ,
                         "(oldBailOutKind & ~IR::BailOutKindBits) == bailOutKind || bailOutKind == IR::BailOutFailedFixedFieldTypeCheck || bailOutKind == IR::BailOutFailedEquivalentFixedFieldTypeCheck"
                        );
      if (!bVar5) {
LAB_003db445:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar7 = 0;
    }
LAB_003db2a2:
    IR::Instr::SetBailOutKind(instr,local_38);
  }
  else {
    if (local_31 != true) {
      bVar5 = IR::PropertySymOpnd::IsTypeCheckSeqCandidate(propertySymOpnd);
      if ((bVar5) && (((propertySymOpnd->field_12).field_0.field_5.typeCheckSeqFlags & 8) != 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x916,"(!propertySymOpnd->IsTypeCheckProtected())",
                           "!propertySymOpnd->IsTypeCheckProtected()");
        if (!bVar5) goto LAB_003db445;
        *puVar7 = 0;
      }
      if (instr->m_opcode != CheckObjType) {
        bVar5 = BasicBlock::IsLandingPad(this->currentBlock);
        if (bVar5) {
          if (this->preOpBailOutInstrToProcess == instr) {
            this->preOpBailOutInstrToProcess = (Instr *)0x0;
          }
          IR::Instr::UnlinkBailOutInfo(instr);
          return;
        }
        if (local_38 == BailOutFailedEquivalentTypeCheck) {
          return;
        }
        if (local_38 == BailOutFailedEquivalentFixedFieldTypeCheck) {
          return;
        }
        pBVar8 = IR::Instr::GetBailOutInfo(instr);
        pBVar8->polymorphicCacheIndex = 0xffffffff;
        if ((int)kind < 0) {
          local_38 = kind & BailOutMarkTempObject | (LazyBailOut|BailOutOnImplicitCallsPreOp);
        }
        else {
          local_38 = kind & BailOutMarkTempObject | BailOutOnImplicitCallsPreOp;
        }
        goto LAB_003db2a2;
      }
      if (((*ppOVar1 != (Opnd *)0x0) || (*ppOVar2 == (Opnd *)0x0)) || (instr->m_src2 != (Opnd *)0x0)
         ) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x91d,
                           "(instr->GetDst() == nullptr && instr->GetSrc1() != nullptr && instr->GetSrc2() == nullptr)"
                           ,
                           "instr->GetDst() == nullptr && instr->GetSrc1() != nullptr && instr->GetSrc2() == nullptr"
                          );
        if (!bVar5) goto LAB_003db445;
        *puVar7 = 0;
      }
      instr->m_opcode = Nop;
      IR::Instr::FreeSrc1(instr);
    }
    IR::Instr::ClearBailOutInfo(instr);
    if (this->preOpBailOutInstrToProcess == instr) {
      this->preOpBailOutInstrToProcess = (Instr *)0x0;
    }
  }
  return;
}

Assistant:

void
BackwardPass::DeadStoreTypeCheckBailOut(IR::Instr * instr)
{
    // Good news: There are cases where the forward pass installs BailOutFailedTypeCheck, but the dead store pass
    // discovers that the checked type is dead.
    // Bad news: We may still need implicit call bailout, and it's up to the dead store pass to figure this out.
    // Worse news: BailOutFailedTypeCheck is pre-op, and BailOutOnImplicitCall is post-op. We'll use a special
    // bailout kind to indicate implicit call bailout that targets its own instruction. The lowerer will emit
    // code to disable/re-enable implicit calls around the operation.

    Assert(this->tag == Js::DeadStorePhase);

    if (this->IsPrePass() || !instr->HasBailOutInfo())
    {
        return;
    }

    // By default, do not do this for stores, as it makes the presence of type checks unpredictable in the forward pass.
    // For instance, we can't predict which stores may cause reallocation of aux slots.
    if (instr->GetDst() && instr->GetDst()->IsSymOpnd())
    {
        return;
    }

    const IR::BailOutKind oldBailOutKind = instr->GetBailOutKind();
    if (!IR::IsTypeCheckBailOutKind(oldBailOutKind))
    {
        return;
    }

    // Either src1 or dst must be a property sym operand
    Assert((instr->GetSrc1() && instr->GetSrc1()->IsSymOpnd() && instr->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd()) ||
        (instr->GetDst() && instr->GetDst()->IsSymOpnd() && instr->GetDst()->AsSymOpnd()->IsPropertySymOpnd()));

    IR::PropertySymOpnd *propertySymOpnd =
        (instr->GetDst() && instr->GetDst()->IsSymOpnd()) ? instr->GetDst()->AsPropertySymOpnd() : instr->GetSrc1()->AsPropertySymOpnd();

    if (propertySymOpnd->TypeCheckRequired())
    {
        return;
    }

    bool isTypeCheckProtected = false;
    IR::BailOutKind bailOutKind;
    if (GlobOpt::NeedsTypeCheckBailOut(instr, propertySymOpnd, propertySymOpnd == instr->GetDst(), &isTypeCheckProtected, &bailOutKind))
    {
        // If we installed a failed type check bailout in the forward pass, but we are now discovering that the checked
        // type is dead, we may still need a bailout on failed fixed field type check. These type checks are required
        // regardless of whether the checked type is dead.  Hence, the bailout kind may change here.
        Assert((oldBailOutKind & ~IR::BailOutKindBits) == bailOutKind ||
            bailOutKind == IR::BailOutFailedFixedFieldTypeCheck || bailOutKind == IR::BailOutFailedEquivalentFixedFieldTypeCheck);
        instr->SetBailOutKind(bailOutKind);
        return;
    }
    else if (isTypeCheckProtected)
    {
        instr->ClearBailOutInfo();
        if (preOpBailOutInstrToProcess == instr)
        {
            preOpBailOutInstrToProcess = nullptr;
        }
        return;
    }

    Assert(!propertySymOpnd->IsTypeCheckProtected());

    // If all we're doing here is checking the type (e.g. because we've hoisted a field load or store out of the loop, but needed
    // the type check to remain in the loop), and now it turns out we don't need the type checked, we can simply turn this into
    // a NOP and remove the bailout.
    if (instr->m_opcode == Js::OpCode::CheckObjType)
    {
        Assert(instr->GetDst() == nullptr && instr->GetSrc1() != nullptr && instr->GetSrc2() == nullptr);
        instr->m_opcode = Js::OpCode::Nop;
        instr->FreeSrc1();
        instr->ClearBailOutInfo();
        if (this->preOpBailOutInstrToProcess == instr)
        {
            this->preOpBailOutInstrToProcess = nullptr;
        }
        return;
    }

    // We don't need BailOutFailedTypeCheck but may need BailOutOnImplicitCall.
    // Consider: are we in the loop landing pad? If so, no bailout, since implicit calls will be checked at
    // the end of the block.
    if (this->currentBlock->IsLandingPad())
    {
        // We're in the landing pad.
        if (preOpBailOutInstrToProcess == instr)
        {
            preOpBailOutInstrToProcess = nullptr;
        }
        instr->UnlinkBailOutInfo();
        return;
    }

    // If bailOutKind is equivTypeCheck then leave alone the bailout
    if (bailOutKind == IR::BailOutFailedEquivalentTypeCheck ||
        bailOutKind == IR::BailOutFailedEquivalentFixedFieldTypeCheck)
    {
        return;
    }

    // We're not checking for polymorphism, so don't let the bailout indicate that we
    // detected polymorphism.
    instr->GetBailOutInfo()->polymorphicCacheIndex = (uint)-1;

    // Keep the mark temp object bit if it is there so that we will not remove the implicit call check
    IR::BailOutKind newBailOutKind = IR::BailOutOnImplicitCallsPreOp | (oldBailOutKind & IR::BailOutMarkTempObject);
    if (BailOutInfo::HasLazyBailOut(oldBailOutKind))
    {
        instr->SetBailOutKind(BailOutInfo::WithLazyBailOut(newBailOutKind));
    }
    else
    {
        instr->SetBailOutKind(newBailOutKind);
    }
}